

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O1

REF_STATUS ref_search_distance2(REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz,REF_DBL *distance)

{
  double dVar1;
  double dVar2;
  REF_DBL RVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  dVar2 = *xyz0;
  dVar4 = xyz0[1];
  dVar8 = *xyz1 - dVar2;
  dVar6 = xyz1[1] - dVar4;
  dVar1 = xyz0[2];
  dVar7 = xyz1[2] - dVar1;
  dVar9 = *xyz - dVar2;
  dVar11 = xyz[1] - dVar4;
  dVar10 = xyz[2] - dVar1;
  dVar13 = dVar7 * dVar7 + dVar8 * dVar8 + dVar6 * dVar6;
  dVar12 = dVar10 * dVar7 + dVar9 * dVar8 + dVar6 * dVar11;
  dVar5 = dVar13 * 1e+20;
  if (dVar5 <= -dVar5) {
    dVar5 = -dVar5;
  }
  dVar14 = dVar12;
  if (dVar12 <= -dVar12) {
    dVar14 = -dVar12;
  }
  if (dVar5 <= dVar14) {
    dVar2 = dVar10 * dVar10 + dVar9 * dVar9 + dVar11 * dVar11;
  }
  else {
    dVar12 = dVar12 / dVar13;
    if (dVar12 <= 0.0) {
      dVar12 = 0.0;
    }
    if (1.0 <= dVar12) {
      dVar12 = 1.0;
    }
    dVar5 = *xyz - (dVar8 * dVar12 + dVar2);
    dVar4 = xyz[1] - (dVar6 * dVar12 + dVar4);
    dVar2 = xyz[2] - (dVar12 * dVar7 + dVar1);
    dVar2 = dVar2 * dVar2 + dVar5 * dVar5 + dVar4 * dVar4;
  }
  if (dVar2 < 0.0) {
    RVar3 = sqrt(dVar2);
  }
  else {
    RVar3 = SQRT(dVar2);
  }
  *distance = RVar3;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_search_distance2(REF_DBL *xyz0, REF_DBL *xyz1,
                                        REF_DBL *xyz, REF_DBL *distance) {
  REF_DBL dl[3], dxyz[3], len2, proj2, t;
  dl[0] = xyz1[0] - xyz0[0];
  dl[1] = xyz1[1] - xyz0[1];
  dl[2] = xyz1[2] - xyz0[2];
  dxyz[0] = xyz[0] - xyz0[0];
  dxyz[1] = xyz[1] - xyz0[1];
  dxyz[2] = xyz[2] - xyz0[2];
  len2 = ref_math_dot(dl, dl);
  proj2 = ref_math_dot(dxyz, dl);
  if (ref_math_divisible(proj2, len2)) {
    t = proj2 / len2;
    t = MAX(t, 0.0);
    t = MIN(t, 1.0);
    dxyz[0] = xyz[0] - (xyz0[0] + t * dl[0]);
    dxyz[1] = xyz[1] - (xyz0[1] + t * dl[1]);
    dxyz[2] = xyz[2] - (xyz0[2] + t * dl[2]);
    *distance = sqrt(ref_math_dot(dxyz, dxyz));
  } else { /* length zero, either endpoint */
    *distance = sqrt(ref_math_dot(dxyz, dxyz));
  }

  return REF_SUCCESS;
}